

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIF.cpp
# Opt level: O3

Event * __thiscall LIF::update(LIF *this,double n_dt)

{
  LIF_param *pLVar1;
  Event *pEVar2;
  Clock *pCVar3;
  double dVar4;
  
  this->dt = n_dt;
  if (this->t_rest <= 0.0) {
    dVar4 = this->u;
    pLVar1 = this->param;
    if (pLVar1->u_thresh <= dVar4 && dVar4 != pLVar1->u_thresh) {
      this->u = pLVar1->u_rest;
      this->t_rest = pLVar1->tau_rest;
      pEVar2 = (Event *)operator_new(0x28);
      pEVar2->_vptr_Event = (_func_int **)&PTR_setWeight_00110a70;
      *(undefined4 *)&pEVar2[1]._vptr_Event = 1;
      *(undefined8 *)&pEVar2[1].type = 0x3ff0000000000000;
      pEVar2->type = Spike;
      pCVar3 = Clock::getInstance();
      dVar4 = Clock::getCurrentTime(pCVar3);
      goto LAB_00107fe5;
    }
    this->u = ((pLVar1->r * this->input - dVar4) / pLVar1->tau) * n_dt + dVar4;
    dVar4 = 0.0;
  }
  else {
    this->u = this->param->u_rest;
    dVar4 = this->t_rest - n_dt;
  }
  this->t_rest = dVar4;
  pEVar2 = (Event *)operator_new(0x18);
  pEVar2->_vptr_Event = (_func_int **)&PTR_setWeight_00110ac0;
  pEVar2->type = No;
  pCVar3 = Clock::getInstance();
  dVar4 = Clock::getCurrentTime(pCVar3);
LAB_00107fe5:
  pEVar2->eventTime = dVar4;
  return pEVar2;
}

Assistant:

Event* LIF::update(double n_dt) {
    dt = n_dt;
    if(t_rest > 0.0) {
        rest();
    }
    else if(u > param->u_thresh) {
        fire();
        return new SpikeEvent();
    }
    else {
        integrate();
    }
    return new NoEvent();
}